

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O0

void __thiscall QPainter::drawLines(QPainter *this,QLineF *lines,int lineCount)

{
  bool bVar1;
  uint uVar2;
  TransformationType TVar3;
  QPainterPrivate *adx;
  QPainterPath *pQVar4;
  pointer pQVar5;
  pointer pQVar6;
  uint in_EDX;
  QPainterPath *in_RSI;
  long in_FS_OFFSET;
  int i_1;
  int i;
  uint lineEmulation;
  QPainterPrivate *d;
  DrawOperation in_stack_00000044;
  QPainterPath *in_stack_00000048;
  QPainterPrivate *in_stack_00000050;
  QPainterPath linePath;
  QLineF line;
  unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  int iVar7;
  undefined4 in_stack_ffffffffffffff98;
  QExplicitlySharedDataPointer<QPainterPathPrivate> local_28;
  QPainterPathPrivate *local_20;
  QPainterPathPrivate *local_18;
  QPainterPathPrivate *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  adx = d_func((QPainter *)0x599654);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor> *)0x59966a);
  if ((bVar1) && (0 < (int)in_EDX)) {
    if (adx->extended == (QPaintEngineEx *)0x0) {
      QPainterPrivate::updateState
                ((QPainterPrivate *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78);
      uVar2 = (uint)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x5996cc);
      uVar2 = line_emulation(uVar2);
      if (uVar2 == 0) {
        pQVar6 = std::unique_ptr<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>::operator->
                           ((unique_ptr<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor> *)
                            0x5998e3);
        (*pQVar6->_vptr_QPaintEngine[8])(pQVar6,in_RSI,(ulong)in_EDX);
      }
      else {
        if (uVar2 == 1) {
          std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                    ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x5996ff);
          TVar3 = QTransform::type((QTransform *)CONCAT44(uVar2,in_stack_ffffffffffffff88));
          if (TVar3 == TxTranslate) {
            for (iVar7 = 0; iVar7 < (int)in_EDX; iVar7 = iVar7 + 1) {
              pQVar4 = in_RSI + (long)iVar7 * 4;
              local_28.d.ptr = (totally_ordered_wrapper<QPainterPathPrivate_*>)(pQVar4->d_ptr).d.ptr
              ;
              local_20 = pQVar4[1].d_ptr.d.ptr;
              local_18 = pQVar4[2].d_ptr.d.ptr;
              local_10 = pQVar4[3].d_ptr.d.ptr;
              pQVar5 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::
                       operator->((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)
                                  0x59979f);
              QTransform::dx(&pQVar5->matrix);
              pQVar5 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::
                       operator->((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)
                                  0x5997c1);
              QTransform::dy(&pQVar5->matrix);
              QLineF::translate((QLineF *)CONCAT44(in_EDX,in_stack_ffffffffffffff98),(qreal)adx,
                                (qreal)CONCAT44(uVar2,iVar7));
              pQVar6 = std::unique_ptr<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>::
                       operator->((unique_ptr<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>
                                   *)0x5997f3);
              (*pQVar6->_vptr_QPaintEngine[8])(pQVar6,&local_28,1);
            }
            goto LAB_005998f5;
          }
        }
        QPainterPath::QPainterPath((QPainterPath *)0x599831);
        for (iVar7 = 0; iVar7 < (int)in_EDX; iVar7 = iVar7 + 1) {
          QLineF::p1((QLineF *)CONCAT44(uVar2,in_stack_ffffffffffffff88));
          QPainterPath::moveTo(in_RSI,(QPointF *)CONCAT44(in_EDX,in_stack_ffffffffffffff98));
          QLineF::p2((QLineF *)CONCAT44(uVar2,in_stack_ffffffffffffff88));
          QPainterPath::lineTo(in_RSI,(QPointF *)CONCAT44(in_EDX,in_stack_ffffffffffffff98));
        }
        QPainterPrivate::draw_helper(in_stack_00000050,in_stack_00000048,in_stack_00000044);
        QPainterPath::~QPainterPath((QPainterPath *)0x5998d0);
      }
    }
    else {
      (*(adx->extended->super_QPaintEngine)._vptr_QPaintEngine[8])
                (adx->extended,in_RSI,(ulong)in_EDX);
    }
  }
LAB_005998f5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPainter::drawLines(const QLineF *lines, int lineCount)
{
#ifdef QT_DEBUG_DRAW
    if (qt_show_painter_debug_output)
        printf("QPainter::drawLines(), line count=%d\n", lineCount);
#endif

    Q_D(QPainter);

    if (!d->engine || lineCount < 1)
        return;

    if (d->extended) {
        d->extended->drawLines(lines, lineCount);
        return;
    }

    d->updateState(d->state);

    uint lineEmulation = line_emulation(d->state->emulationSpecifier);

    if (lineEmulation) {
        if (lineEmulation == QPaintEngine::PrimitiveTransform
            && d->state->matrix.type() == QTransform::TxTranslate) {
            for (int i = 0; i < lineCount; ++i) {
                QLineF line = lines[i];
                line.translate(d->state->matrix.dx(), d->state->matrix.dy());
                d->engine->drawLines(&line, 1);
            }
        } else {
            QPainterPath linePath;
            for (int i = 0; i < lineCount; ++i) {
                linePath.moveTo(lines[i].p1());
                linePath.lineTo(lines[i].p2());
            }
            d->draw_helper(linePath, QPainterPrivate::StrokeDraw);
        }
        return;
    }
    d->engine->drawLines(lines, lineCount);
}